

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void dumb_resample_get_current_sample_n_1_2
               (int n,DUMB_RESAMPLER *resampler,DUMB_VOLUME_RAMP_INFO *volume_left,
               DUMB_VOLUME_RAMP_INFO *volume_right,sample_t_conflict *dst)

{
  int in_EDI;
  sample_t_conflict *in_stack_00000038;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000040;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000048;
  DUMB_RESAMPLER *in_stack_00000050;
  
  if (in_EDI == 8) {
    dumb_resample_get_current_sample_8_1_2
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else if (in_EDI == 0x10) {
    dumb_resample_get_current_sample_16_1_2
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else {
    dumb_resample_get_current_sample_1_2
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void dumb_resample_get_current_sample_n_1_2(int n, DUMB_RESAMPLER *resampler, DUMB_VOLUME_RAMP_INFO * volume_left, DUMB_VOLUME_RAMP_INFO * volume_right, sample_t *dst)
{
	if (n == 8)
		dumb_resample_get_current_sample_8_1_2(resampler, volume_left, volume_right, dst);
	else if (n == 16)
		dumb_resample_get_current_sample_16_1_2(resampler, volume_left, volume_right, dst);
	else
		dumb_resample_get_current_sample_1_2(resampler, volume_left, volume_right, dst);
}